

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

_Bool ray_intersect_segments
                (vec3 ro,vec3 rd,vec3 *p0,vec3 *p1,float *radius,int num_segments,float *t,int *idx)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  float fVar5;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  vec3 p1_00;
  vec3 q1;
  vec3 p2;
  vec3 q2;
  float local_90;
  float s0;
  float *local_80;
  int *local_78;
  float t0;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  vec3 c1;
  vec3 c0;
  
  p1_00.z = ro.z;
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = ro._0_8_;
  local_68._12_4_ = in_XMM0_Dd;
  local_58 = rd.x + ro.x;
  fStack_54 = rd.y + ro.y;
  fStack_50 = in_XMM2_Dc + in_XMM0_Dc;
  fStack_4c = in_XMM2_Dd + in_XMM0_Dd;
  q1.z = rd.z + p1_00.z;
  uVar2 = 0;
  uVar4 = (ulong)(uint)num_segments;
  if (num_segments < 1) {
    uVar4 = uVar2;
  }
  local_90 = 3.4028235e+38;
  lVar3 = 2;
  local_80 = t;
  local_78 = idx;
  for (; auVar1 = local_68, uVar4 != uVar2; uVar2 = uVar2 + 1) {
    q1.y = fStack_54;
    q1.x = local_58;
    p1_00.x = (float)local_68._0_4_;
    p1_00.y = (float)local_68._4_4_;
    p2.z = (&p0->x)[lVar3];
    p2._0_8_ = *(undefined8 *)((long)p0 + lVar3 * 4 + -8);
    q2.z = (&p1->x)[lVar3];
    q2._0_8_ = *(undefined8 *)((long)p1 + lVar3 * 4 + -8);
    local_68 = auVar1;
    fVar5 = closest_point_ray_segment(p1_00,q1,p2,q2,&s0,&t0,&c0,&c1);
    if ((fVar5 < radius[uVar2] * radius[uVar2]) && (s0 < local_90)) {
      *local_78 = (int)uVar2;
      local_90 = s0;
    }
    lVar3 = lVar3 + 3;
  }
  *local_80 = local_90;
  return local_90 < 3.4028235e+38;
}

Assistant:

bool ray_intersect_segments(vec3 ro, vec3 rd, vec3 *p0, vec3 *p1, float *radius, int num_segments, float *t, int *idx) {
    float min_t = FLT_MAX;

    for (int i = 0; i < num_segments; i++) {
        float s0, t0;
        vec3 c0, c1;
        float dist = closest_point_ray_segment(ro, vec3_add(ro, rd), p0[i], p1[i], &s0, &t0, &c0, &c1);
        if (dist < radius[i] * radius[i]) {
            if (s0 < min_t) {
                min_t = s0;
                *idx = i;
            }
        }
    }

    *t = min_t;
    return min_t < FLT_MAX;
}